

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

int mcpl_str2int(char *str,size_t len,int64_t *res)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  *res = 0;
  if ((len == 0) && (len = strlen(str), len == 0)) {
    iVar1 = 0;
  }
  else {
    uVar2 = (ulong)(*str == '-');
    if (len == uVar2) {
      lVar5 = 0;
    }
    else {
      lVar4 = 0;
      lVar3 = 0;
      do {
        if ((byte)(str[lVar4 + uVar2] - 0x3aU) < 0xf6) {
          return 0;
        }
        lVar5 = (ulong)(byte)(str[lVar4 + uVar2] - 0x30) + lVar3 * 10;
        if (lVar5 <= lVar3) goto LAB_001062f0;
        lVar4 = lVar4 + 1;
        lVar3 = lVar5;
      } while (len - uVar2 != lVar4);
    }
    lVar3 = -lVar5;
    if (*str != '-') {
      lVar3 = lVar5;
    }
    *res = lVar3;
LAB_001062f0:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

MCPL_LOCAL int mcpl_str2int(const char* str, size_t len, int64_t* res)
{
  //portable 64bit str2int with error checking (only INT64_MIN might not be
  //possible to specify).
  *res = 0;
  if (!len)
    len=strlen(str);
  if (!len)
    return 0;
  int sign = 1;
  if (str[0]=='-') {
    sign = -1;
    len -= 1;
    str += 1;
  }
  int64_t tmp = 0;
  size_t i;
  for (i=0; i<len; ++i) {
    if (str[i]<'0'||str[i]>'9') {
      return 0;
    }
    int64_t prev = tmp;
    tmp *= 10;
    tmp += str[i] - '0';
    if (prev>=tmp)
      return 1;//overflow (hopefully it did not trigger a signal or FPE)
  }
  *res = sign * tmp;
  return 1;
}